

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsReadOnlyLoad(Instruction *this)

{
  bool bVar1;
  bool bVar2;
  Op OVar3;
  uint32_t id;
  int iVar4;
  Instruction *this_00;
  TypeManager *this_01;
  Type *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  
  bVar1 = IsLoad(this);
  if (bVar1) {
    this_00 = GetBaseAddress(this);
    bVar1 = this_00 != (Instruction *)0x0;
    if (this_00 == (Instruction *)0x0) {
      return bVar1;
    }
    OVar3 = this_00->opcode_;
    if (OVar3 == OpVariable) {
      bVar2 = IsReadOnlyPointer(this_00);
      if (bVar2) {
        return bVar1;
      }
      OVar3 = this_00->opcode_;
    }
    if (OVar3 == OpLoad) {
      this_01 = IRContext::get_type_mgr(this->context_);
      id = type_id(this_00);
      pTVar5 = analysis::TypeManager::GetType(this_01,id);
      iVar4 = (*pTVar5->_vptr_Type[0x16])(pTVar5);
      if (CONCAT44(extraout_var,iVar4) != 0) {
        iVar4 = (*pTVar5->_vptr_Type[0x16])(pTVar5);
        lVar6 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar4) + 0x28) + 0x90))();
        if (*(int *)(lVar6 + 0x3c) == 1) {
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsReadOnlyLoad() const {
  if (IsLoad()) {
    Instruction* address_def = GetBaseAddress();
    if (!address_def) {
      return false;
    }

    if (address_def->opcode() == spv::Op::OpVariable) {
      if (address_def->IsReadOnlyPointer()) {
        return true;
      }
    }

    if (address_def->opcode() == spv::Op::OpLoad) {
      const analysis::Type* address_type =
          context()->get_type_mgr()->GetType(address_def->type_id());
      if (address_type->AsSampledImage() != nullptr) {
        const auto* image_type =
            address_type->AsSampledImage()->image_type()->AsImage();
        if (image_type->sampled() == 1) {
          return true;
        }
      }
    }
  }
  return false;
}